

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall Renderer::setPreviewNote(Renderer *this,int note)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  int __type;
  uint8_t local_40;
  uint8_t uStack_3f;
  int freq;
  undefined1 local_30 [8];
  Locked<Renderer::RenderContext> ctx;
  int note_local;
  Renderer *this_local;
  
  ctx.mRef._4_4_ = note;
  bVar1 = AudioStream::isEnabled(&this->mStream);
  if (bVar1) {
    Guarded<Renderer::RenderContext>::access
              ((Guarded<Renderer::RenderContext> *)local_30,(char *)&this->mContext,__type);
    pRVar3 = Locked<Renderer::RenderContext>::operator->
                       ((Locked<Renderer::RenderContext> *)local_30);
    if (pRVar3->previewState == waveform) {
      iVar2 = trackerboy::lookupToneNote(ctx.mRef._4_4_);
      pRVar3 = Locked<Renderer::RenderContext>::operator->
                         ((Locked<Renderer::RenderContext> *)local_30);
      local_40 = (uint8_t)iVar2;
      trackerboy::DefaultApu::writeRegister(&pRVar3->apu,'\x1d',local_40);
      pRVar3 = Locked<Renderer::RenderContext>::operator->
                         ((Locked<Renderer::RenderContext> *)local_30);
      uStack_3f = (uint8_t)((uint)iVar2 >> 8);
      trackerboy::DefaultApu::writeRegister(&pRVar3->apu,'\x1e',uStack_3f);
    }
    else if (pRVar3->previewState == instrument) {
      pRVar3 = Locked<Renderer::RenderContext>::operator->
                         ((Locked<Renderer::RenderContext> *)local_30);
      trackerboy::InstrumentPreview::play(&pRVar3->ip,ctx.mRef._4_1_);
    }
    Locked<Renderer::RenderContext>::~Locked((Locked<Renderer::RenderContext> *)local_30);
  }
  return;
}

Assistant:

void Renderer::setPreviewNote(int note) {
    if (mStream.isEnabled()) {
        auto ctx = mContext.access();
        switch (ctx->previewState) {
            case PreviewState::waveform: {
                auto freq = trackerboy::lookupToneNote(note);
                ctx->apu.writeRegister(trackerboy::Apu::REG_NR33, (uint8_t)(freq & 0xFF));
                ctx->apu.writeRegister(trackerboy::Apu::REG_NR34, (uint8_t)(freq >> 8));
                break;
            }
            case PreviewState::instrument:
                // update the current note
                ctx->ip.play((uint8_t)note);
                break;
            default:
                break;
        
        }
    }
}